

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O2

XMLCh * __thiscall xercesc_4_0::DOMDocumentImpl::cloneString(DOMDocumentImpl *this,XMLCh *src)

{
  int iVar1;
  XMLSize_t XVar2;
  undefined4 extraout_var;
  XMLCh *target;
  
  if (src == (XMLCh *)0x0) {
    target = (XMLCh *)0x0;
  }
  else {
    XVar2 = XMLString::stringLen(src);
    iVar1 = (*(this->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                      (this,(ulong)((int)XVar2 * 2 + 2U & 2) + XVar2 * 2 + 2);
    target = (XMLCh *)CONCAT44(extraout_var,iVar1);
    XMLString::copyString(target,src);
  }
  return target;
}

Assistant:

XMLCh * DOMDocumentImpl::cloneString(const XMLCh *src)
{
    if (!src) return 0;
    XMLSize_t len = XMLString::stringLen(src);
    len = (len + 1) * sizeof(XMLCh);
    len = (len % 4) + len;
    XMLCh *newStr = (XMLCh *)this->allocate(len);
    XMLString::copyString(newStr, src);
    return newStr;
}